

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void JS_FreeContext(JSContext *ctx)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  JSValue v_06;
  JSValue v_07;
  JSValue v_08;
  JSValue v_09;
  JSValue v_10;
  JSValue v_11;
  JSValue v_12;
  int *in_RDI;
  int i;
  JSContext *unaff_retaddr;
  JSRuntime *rt;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar1;
  JSContext *ctx_00;
  undefined4 uVar2;
  JSFreeModuleEnum flag;
  
  uVar2 = SUB84(in_RDI,0);
  flag = (JSFreeModuleEnum)((ulong)in_RDI >> 0x20);
  ctx_00 = *(JSContext **)(in_RDI + 6);
  iVar1 = *in_RDI;
  *in_RDI = iVar1 + -1;
  if (iVar1 + -1 < 1) {
    js_free_modules(unaff_retaddr,flag);
    v.u._4_4_ = flag;
    v.u.int32 = uVar2;
    v.tag = (int64_t)unaff_retaddr;
    JS_FreeValue(ctx_00,v);
    v_00.u._4_4_ = flag;
    v_00.u.int32 = uVar2;
    v_00.tag = (int64_t)unaff_retaddr;
    JS_FreeValue(ctx_00,v_00);
    v_01.u._4_4_ = flag;
    v_01.u.int32 = uVar2;
    v_01.tag = (int64_t)unaff_retaddr;
    JS_FreeValue(ctx_00,v_01);
    v_02.u._4_4_ = flag;
    v_02.u.int32 = uVar2;
    v_02.tag = (int64_t)unaff_retaddr;
    JS_FreeValue(ctx_00,v_02);
    v_03.u._4_4_ = flag;
    v_03.u.int32 = uVar2;
    v_03.tag = (int64_t)unaff_retaddr;
    JS_FreeValue(ctx_00,v_03);
    for (iVar1 = 0; iVar1 < 8; iVar1 = iVar1 + 1) {
      v_04.u._4_4_ = flag;
      v_04.u.int32 = uVar2;
      v_04.tag = (int64_t)unaff_retaddr;
      JS_FreeValue(ctx_00,v_04);
    }
    for (iVar1 = 0; iVar1 < *(int *)((long)&(ctx_00->array_ctor).u + 4); iVar1 = iVar1 + 1) {
      v_05.u._4_4_ = flag;
      v_05.u.int32 = uVar2;
      v_05.tag = (int64_t)unaff_retaddr;
      JS_FreeValue(ctx_00,v_05);
    }
    js_free_rt((JSRuntime *)ctx_00,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
    v_06.u._4_4_ = flag;
    v_06.u.int32 = uVar2;
    v_06.tag = (int64_t)unaff_retaddr;
    JS_FreeValue(ctx_00,v_06);
    v_07.u._4_4_ = flag;
    v_07.u.int32 = uVar2;
    v_07.tag = (int64_t)unaff_retaddr;
    JS_FreeValue(ctx_00,v_07);
    v_08.u._4_4_ = flag;
    v_08.u.int32 = uVar2;
    v_08.tag = (int64_t)unaff_retaddr;
    JS_FreeValue(ctx_00,v_08);
    v_09.u._4_4_ = flag;
    v_09.u.int32 = uVar2;
    v_09.tag = (int64_t)unaff_retaddr;
    JS_FreeValue(ctx_00,v_09);
    v_10.u._4_4_ = flag;
    v_10.u.int32 = uVar2;
    v_10.tag = (int64_t)unaff_retaddr;
    JS_FreeValue(ctx_00,v_10);
    v_11.u._4_4_ = flag;
    v_11.u.int32 = uVar2;
    v_11.tag = (int64_t)unaff_retaddr;
    JS_FreeValue(ctx_00,v_11);
    v_12.u._4_4_ = flag;
    v_12.u.int32 = uVar2;
    v_12.tag = (int64_t)unaff_retaddr;
    JS_FreeValue(ctx_00,v_12);
    js_free_shape_null((JSRuntime *)ctx_00,(JSShape *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
    list_del((list_head *)(CONCAT44(flag,uVar2) + 0x20));
    remove_gc_object((JSGCObjectHeader *)0x120acf);
    js_free_rt((JSRuntime *)ctx_00,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

void JS_FreeContext(JSContext *ctx)
{
    JSRuntime *rt = ctx->rt;
    int i;

    if (--ctx->header.ref_count > 0)
        return;
    assert(ctx->header.ref_count == 0);
    
#ifdef DUMP_ATOMS
    JS_DumpAtoms(ctx->rt);
#endif
#ifdef DUMP_SHAPES
    JS_DumpShapes(ctx->rt);
#endif
#ifdef DUMP_OBJECTS
    {
        struct list_head *el;
        JSGCObjectHeader *p;
        printf("JSObjects: {\n");
        JS_DumpObjectHeader(ctx->rt);
        list_for_each(el, &rt->gc_obj_list) {
            p = list_entry(el, JSGCObjectHeader, link);
            JS_DumpGCObject(rt, p);
        }
        printf("}\n");
    }
#endif
#ifdef DUMP_MEM
    {
        JSMemoryUsage stats;
        JS_ComputeMemoryUsage(rt, &stats);
        JS_DumpMemoryUsage(stdout, &stats, rt);
    }
#endif

    js_free_modules(ctx, JS_FREE_MODULE_ALL);

    JS_FreeValue(ctx, ctx->global_obj);
    JS_FreeValue(ctx, ctx->global_var_obj);

    JS_FreeValue(ctx, ctx->throw_type_error);
    JS_FreeValue(ctx, ctx->eval_obj);

    JS_FreeValue(ctx, ctx->array_proto_values);
    for(i = 0; i < JS_NATIVE_ERROR_COUNT; i++) {
        JS_FreeValue(ctx, ctx->native_error_proto[i]);
    }
    for(i = 0; i < rt->class_count; i++) {
        JS_FreeValue(ctx, ctx->class_proto[i]);
    }
    js_free_rt(rt, ctx->class_proto);
    JS_FreeValue(ctx, ctx->iterator_proto);
    JS_FreeValue(ctx, ctx->async_iterator_proto);
    JS_FreeValue(ctx, ctx->promise_ctor);
    JS_FreeValue(ctx, ctx->array_ctor);
    JS_FreeValue(ctx, ctx->regexp_ctor);
    JS_FreeValue(ctx, ctx->function_ctor);
    JS_FreeValue(ctx, ctx->function_proto);

    js_free_shape_null(ctx->rt, ctx->array_shape);

    list_del(&ctx->link);
    remove_gc_object(&ctx->header);
    js_free_rt(ctx->rt, ctx);
}